

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O2

ProString * __thiscall
QMakeProperty::value(ProString *__return_storage_ptr__,QMakeProperty *this,ProKey *vk)

{
  QSettings *pQVar1;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  ProString val;
  QArrayDataPointer<char16_t> QStack_a8;
  QArrayDataPointer<char16_t> local_90;
  ProString local_78;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.m_file = -0x55555556;
  local_78._36_4_ = 0xaaaaaaaa;
  local_78.m_hash = 0xaaaaaaaaaaaaaaaa;
  local_78.m_string.d.size = -0x5555555555555556;
  local_78.m_offset = -0x55555556;
  local_78.m_length = -0x55555556;
  local_78.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_78.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QHash<ProKey,_ProString>::value(&local_78,&this->m_values,vk);
  if (local_78.m_string.d.ptr == (char16_t *)0x0) {
    initSettings(this);
    pQVar1 = this->settings;
    ProString::toQString((QString *)&QStack_a8,&vk->super_ProString);
    QVar2.m_size = (size_t)pQVar1;
    QVar2.field_0.m_data = local_48;
    QSettings::value(QVar2);
    QVariant::toString();
    ProString::ProString(__return_storage_ptr__,(QString *)&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    QVariant::~QVariant((QVariant *)local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_a8);
  }
  else {
    ProString::ProString(__return_storage_ptr__,&local_78);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProString
QMakeProperty::value(const ProKey &vk)
{
    ProString val = m_values.value(vk);
    if (!val.isNull())
        return val;

    initSettings();
    return settings->value(vk.toQString()).toString();
}